

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O0

void __thiscall
CheckedMutexTest_RecurseLock_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedMutexTest_RecurseLock_Test<yamc::checked::timed_mutex> *this)

{
  pointer pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *regex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  AssertHelper local_1c0;
  Message local_1b8 [6];
  exception *e_1;
  TrueWithString gtest_msg_1;
  Message local_160 [6];
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  local_120;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_100;
  DeathTest *gtest_dt;
  AssertHelper local_d8;
  Message local_d0 [6];
  exception *e;
  undefined1 local_90 [8];
  TrueWithString gtest_msg;
  TypeParam mtx;
  CheckedMutexTest_RecurseLock_Test<yamc::checked::timed_mutex> *this_local;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)(gtest_msg.value.field_2._M_local_buf + 8))
  ;
  memset(local_90,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_90);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_90);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      yamc::checked::detail::mutex_base::lock((mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_dt,
                   "Expected: mtx.lock() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x50,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_dt);
    testing::Message::~Message(local_d0);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_90);
  if ((int)e != 0) goto LAB_001e366d;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)0x27c39e,regex);
    bVar2 = testing::internal::DeathTest::Create
                      ("mtx.lock()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0x51,&local_100);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_001e3272;
    if (local_100 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&local_120,local_100);
      iVar3 = (*local_100->_vptr_DeathTest[2])();
      pDVar1 = local_100;
      if (iVar3 == 0) {
        testing::KilledBySignal::KilledBySignal
                  ((KilledBySignal *)((long)&gtest_sentinel.test_ + 4),6);
        iVar3 = (*local_100->_vptr_DeathTest[3])();
        testing::KilledBySignal::operator()
                  ((KilledBySignal *)((long)&gtest_sentinel.test_ + 4),iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])();
        if ((((byte)iVar3 ^ 0xff) & 1) == 0) goto LAB_001e3220;
        e._0_4_ = 3;
      }
      else {
        if (iVar3 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception,local_100);
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            yamc::checked::detail::mutex_base::lock
                      ((mutex_base *)((long)&gtest_msg.value.field_2 + 8));
          }
          (*local_100->_vptr_DeathTest[5])();
          e._0_4_ = 4;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception);
        }
LAB_001e3220:
        e._0_4_ = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr(&local_120);
      if ((int)e != 0) {
        if ((int)e != 3) goto LAB_001e366d;
        goto LAB_001e3272;
      }
    }
  }
  else {
LAB_001e3272:
    testing::Message::Message(local_160);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&gtest_msg_1.value.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x51,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&gtest_msg_1.value.field_2 + 8),local_160);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&gtest_msg_1.value.field_2 + 8));
    testing::Message::~Message(local_160);
  }
  memset(&e_1,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_1);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_1);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      yamc::checked::detail::mutex_base::unlock((mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_1b8);
    std::operator+(&local_1e0,"Expected: mtx.unlock() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x52,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c0,local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    testing::Message::~Message(local_1b8);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_1);
  if ((int)e == 0) {
    e._0_4_ = 0;
  }
LAB_001e366d:
  yamc::checked::timed_mutex::~timed_mutex
            ((timed_mutex *)(gtest_msg.value.field_2._M_local_buf + 8));
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, RecurseLock) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  EXPECT_CHECK_FAILURE(mtx.lock());
  ASSERT_NO_THROW(mtx.unlock());
}